

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse.h
# Opt level: O0

void FSE_initCState2(FSE_CState_t *statePtr,FSE_CTable *ct,U32 symbol)

{
  undefined8 uVar1;
  U32 nbBitsOut;
  U16 *stateTable;
  int iStack_20;
  FSE_symbolCompressionTransform symbolTT;
  U32 symbol_local;
  FSE_CTable *ct_local;
  FSE_CState_t *statePtr_local;
  
  FSE_initCState(statePtr,ct);
  uVar1 = *(undefined8 *)((long)statePtr->symbolTT + (ulong)symbol * 8);
  iStack_20 = (int)((ulong)uVar1 >> 0x20);
  statePtr->value = (ulong)((iStack_20 + 0x8000U & 0xffff0000) - iStack_20);
  stateTable._4_4_ = (int)uVar1;
  statePtr->value =
       (ulong)*(ushort *)
               ((long)statePtr->stateTable +
               ((statePtr->value >> ((byte)(iStack_20 + 0x8000U >> 0x10) & 0x3f)) +
               (long)stateTable._4_4_) * 2);
  return;
}

Assistant:

MEM_STATIC void FSE_initCState2(FSE_CState_t* statePtr, const FSE_CTable* ct, U32 symbol)
{
    FSE_initCState(statePtr, ct);
    {   const FSE_symbolCompressionTransform symbolTT = ((const FSE_symbolCompressionTransform*)(statePtr->symbolTT))[symbol];
        const U16* stateTable = (const U16*)(statePtr->stateTable);
        U32 nbBitsOut  = (U32)((symbolTT.deltaNbBits + (1<<15)) >> 16);
        statePtr->value = (nbBitsOut << 16) - symbolTT.deltaNbBits;
        statePtr->value = stateTable[(statePtr->value >> nbBitsOut) + symbolTT.deltaFindState];
    }
}